

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O1

bool __thiscall
nuraft::raft_server::handle_snapshot_sync_req(raft_server *this,snapshot_sync_req *req)

{
  ulong uVar1;
  element_type *peVar2;
  element_type *peVar3;
  context *pcVar4;
  element_type *peVar5;
  buffer *this_00;
  element_type *peVar6;
  long *plVar7;
  ulong uVar8;
  bool bVar9;
  char cVar10;
  char cVar11;
  int iVar12;
  ReturnCode RVar13;
  int *piVar14;
  undefined8 uVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  ptr<cluster_config> pVar19;
  ulong obj_id;
  ptr<snapshot> new_snp;
  ptr<cluster_config> c_conf;
  type local_e2;
  undefined1 local_e1;
  undefined1 local_e0 [32];
  _Any_data local_c0;
  char local_b0 [16];
  ptr<snapshot> local_a0;
  undefined1 local_90 [20];
  __int_type_conflict local_7c;
  undefined4 local_78;
  thread local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  ulong local_40;
  ulong local_38;
  
  uVar1 = req->offset_;
  bVar9 = req->done_;
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((uVar1 != 0 & (bVar9 ^ 1U)) == 0) {
    if (peVar2 != (element_type *)0x0) {
      iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
      if (3 < iVar12) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pcVar17 = "first obj";
        if (uVar1 != 0) {
          pcVar17 = "";
        }
        pcVar16 = "last obj";
        if (bVar9 == false) {
          pcVar16 = "";
        }
        msg_if_given_abi_cxx11_
                  ((string *)&local_c0,"save snapshot (idx %lu, term %lu) offset 0x%lx, %s %s",
                   peVar3->last_log_idx_,peVar3->last_log_term_,req->offset_,pcVar17,pcVar16);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_snapshot_sync_req",0x1d8,&local_c0);
LAB_001e809b:
        if ((char *)local_c0._M_unused._0_8_ != local_b0) {
          operator_delete(local_c0._M_unused._M_object);
        }
      }
    }
  }
  else if (peVar2 != (element_type *)0x0) {
    iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
    if (4 < iVar12) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&local_c0,"save snapshot (idx %lu, term %lu) offset 0x%lx, %s %s",
                 peVar3->last_log_idx_,peVar3->last_log_term_,req->offset_,"","");
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_snapshot_sync_req",0x1e1,&local_c0);
      goto LAB_001e809b;
    }
  }
  local_90._16_4_ = this->id_;
  local_7c = (this->leader_).super___atomic_base<int>._M_i;
  local_78 = 0xffffffff;
  pcVar4 = (this->ctx_)._M_t.
           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
           super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
  local_70._M_id._M_thread = (id)(id)req;
  if ((pcVar4->cb_func_).func.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001e810b:
    LOCK();
    (this->receiving_snapshot_)._M_base._M_i = true;
    UNLOCK();
    LOCK();
    (this->et_cnt_receiving_snapshot_).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if (((this->initialized_)._M_base._M_i & 1U) == 0) {
      LOCK();
      (this->initialized_)._M_base._M_i = true;
      UNLOCK();
    }
    peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->type_ == raw_binary) {
      peVar5 = (this->state_machine_).
               super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)(*(long *)peVar5 + 0x50))
                (peVar5,peVar3,req->offset_,
                 (req->data_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
    }
    else {
      local_c0._M_unused._0_8_ = (undefined8)req->offset_;
      this_00 = (req->data_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      buffer::pos(this_00,0);
      peVar5 = (this->state_machine_).
               super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)(*(long *)peVar5 + 0x58))
                (peVar5,(req->snapshot_).
                        super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_c0,this_00,uVar1 == 0,bVar9);
      req->offset_ = (ulong)local_c0._M_unused._0_8_;
    }
    if (bVar9 != false) {
      pause_state_machine_exeuction(this,0);
      lVar18 = 0;
      while( true ) {
        bVar9 = wait_for_state_machine_pause(this,500);
        if (bVar9) break;
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
          if (3 < iVar12) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            lVar18 = lVar18 + 1;
            msg_if_given_abi_cxx11_
                      ((string *)&local_c0,
                       "waiting for state machine pause before applying snapshot: count %zu",lVar18)
            ;
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x20f,&local_c0);
            if ((char *)local_c0._M_unused._0_8_ != local_b0) {
              operator_delete(local_c0._M_unused._M_object);
            }
          }
        }
      }
      if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
        do {
          local_e0._0_8_ = (Param *)0x0;
          local_e0._8_8_ = 500000000;
          do {
            iVar12 = nanosleep((timespec *)local_e0,(timespec *)local_e0);
            if (iVar12 != -1) break;
            piVar14 = __errno_location();
          } while (*piVar14 == 4);
        } while (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0);
      }
      local_68._8_8_ = 0;
      pcStack_50 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx:536:28)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx:536:28)>
                 ::_M_manager;
      local_68._M_unused._M_object = this;
      std::function<void_()>::function
                ((function<void_()> *)&local_c0,(function<void_()> *)&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      LOCK();
      (this->receiving_snapshot_)._M_base._M_i = false;
      UNLOCK();
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((this->role_)._M_i != follower) {
        if (peVar2 != (element_type *)0x0) {
          iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
          if (1 < iVar12) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_e0,
                       "bad server role for applying a snapshot, exit for debugging");
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x220,local_e0);
            if ((Param *)local_e0._0_8_ != (Param *)(local_e0 + 0x10)) {
              operator_delete((void *)local_e0._0_8_);
            }
          }
        }
        plVar7 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar7 + 0x40))(plVar7,0xfffffff5);
LAB_001e8907:
        exit(-1);
      }
      if (peVar2 != (element_type *)0x0) {
        iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (3 < iVar12) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_e0,
                     "successfully receive a snapshot (idx %lu term %lu) from leader",
                     peVar3->last_log_idx_,peVar3->last_log_term_);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_snapshot_sync_req",0x229,local_e0);
          if ((Param *)local_e0._0_8_ != (Param *)(local_e0 + 0x10)) {
            operator_delete((void *)local_e0._0_8_);
          }
        }
      }
      peVar6 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      cVar10 = (**(code **)(*(long *)peVar6 + 0x70))
                         (peVar6,((req->snapshot_).
                                  super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->last_log_idx_);
      if (cVar10 == '\0') {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
          if (1 < iVar12) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_e0,
                       "failed to compact the log store after a snapshot is received, will ask the leader to retry"
                      );
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x25a,local_e0);
            if ((Param *)local_e0._0_8_ != (Param *)(local_e0 + 0x10)) {
              operator_delete((void *)local_e0._0_8_);
            }
          }
        }
      }
      else {
        stop_election_timer(this);
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
          if (3 < iVar12) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_e0,
                       "successfully compact the log store, will now ask the statemachine to apply the snapshot"
                      );
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x231,local_e0);
            if ((Param *)local_e0._0_8_ != (Param *)(local_e0 + 0x10)) {
              operator_delete((void *)local_e0._0_8_);
            }
          }
        }
        peVar5 = (this->state_machine_).
                 super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        cVar11 = (**(code **)(*(long *)peVar5 + 0x60))
                           (peVar5,(req->snapshot_).
                                   super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
        if (cVar11 == '\0') {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2 != (element_type *)0x0) {
            iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
            if (1 < iVar12) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)local_e0,
                         "failed to apply the snapshot after log compacted, to ensure the safety, will shutdown the system"
                        );
              (**(code **)(*(long *)peVar2 + 0x40))
                        (peVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                         ,"handle_snapshot_sync_req",0x235,local_e0);
              if ((Param *)local_e0._0_8_ != (Param *)(local_e0 + 0x10)) {
                operator_delete((void *)local_e0._0_8_);
              }
            }
          }
          plVar7 = *(long **)&(((this->ctx_)._M_t.
                                super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                              state_mgr_).
                              super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
          (**(code **)(*plVar7 + 0x40))(plVar7,0xfffffff4);
          goto LAB_001e8907;
        }
        reconfigure(this,&((req->snapshot_).
                           super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->last_config_);
        pVar19 = get_config((raft_server *)local_90);
        plVar7 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar7 + 0x18))
                  (plVar7,CONCAT44(local_90._4_4_,local_90._0_4_),
                   pVar19.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        LOCK();
        (this->precommit_index_).super___atomic_base<unsigned_long>._M_i =
             ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->last_log_idx_;
        UNLOCK();
        LOCK();
        (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i =
             ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->last_log_idx_;
        UNLOCK();
        LOCK();
        (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i =
             ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->last_log_idx_;
        UNLOCK();
        LOCK();
        (this->lagging_sm_target_index_).super___atomic_base<unsigned_long>._M_i =
             ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->last_log_idx_;
        UNLOCK();
        plVar7 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar7 + 0x20))
                  (plVar7,(this->state_).
                          super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_e0._0_8_ = peVar3->last_log_idx_;
        local_38 = peVar3->last_log_term_;
        local_40 = peVar3->size_;
        local_e2 = peVar3->type_;
        local_a0.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<nuraft::snapshot,std::allocator<nuraft::snapshot>,unsigned_long,unsigned_long,std::shared_ptr<nuraft::cluster_config>&,unsigned_long,nuraft::snapshot::type>
                  (&local_a0.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(snapshot **)&local_a0,(allocator<nuraft::snapshot> *)&local_e1,
                   (unsigned_long *)local_e0,&local_38,
                   (shared_ptr<nuraft::cluster_config> *)local_90,&local_40,&local_e2);
        set_last_snapshot(this,&local_a0);
        restart_election_timer(this);
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
          if (3 < iVar12) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            uVar1 = (local_a0.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->last_log_idx_;
            uVar8 = (local_a0.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->last_log_term_;
            uVar15 = (**(code **)(*(long *)(this->log_store_).
                                           super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + 0x18))();
            lVar18 = (**(code **)(*(long *)(this->log_store_).
                                           super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + 0x10))();
            msg_if_given_abi_cxx11_
                      ((string *)local_e0,
                       "snapshot idx %lu term %lu is successfully applied, log start %lu last idx %lu"
                       ,uVar1,uVar8,uVar15,lVar18 + -1);
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x256,local_e0);
            if ((Param *)local_e0._0_8_ != (Param *)(local_e0 + 0x10)) {
              operator_delete((void *)local_e0._0_8_);
            }
          }
        }
        if (local_a0.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_90._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
        }
      }
      handle_snapshot_sync_req::ExecAutoResume::~ExecAutoResume((ExecAutoResume *)&local_c0);
      if (cVar10 == '\0') goto LAB_001e86b3;
    }
    bVar9 = true;
  }
  else {
    local_90._0_4_ = SaveSnapshot;
    local_e0._0_8_ = local_90 + 0x10;
    RVar13 = (*(pcVar4->cb_func_).func._M_invoker)
                       ((_Any_data *)&pcVar4->cb_func_,(Type *)local_90,(Param **)local_e0);
    if (RVar13 != ReturnNull) goto LAB_001e810b;
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar12 = (**(code **)(*(long *)peVar2 + 0x38))();
      if (2 < iVar12) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)&local_c0,"by callback, return false");
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_snapshot_sync_req",0x1e8,&local_c0);
        if ((char *)local_c0._M_unused._0_8_ != local_b0) {
          operator_delete(local_c0._M_unused._M_object);
        }
      }
    }
LAB_001e86b3:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool raft_server::handle_snapshot_sync_req(snapshot_sync_req& req) {
 try {
    // if offset == 0, it is the first object.
    bool is_first_obj = (req.get_offset()) ? false : true;
    bool is_last_obj = req.is_done();
    if (is_first_obj || is_last_obj) {
        // INFO level: log only first and last object.
        p_in("save snapshot (idx %" PRIu64 ", term %" PRIu64 ") offset 0x%" PRIx64
             ", %s %s",
             req.get_snapshot().get_last_log_idx(),
             req.get_snapshot().get_last_log_term(),
             req.get_offset(),
             (is_first_obj) ? "first obj" : "",
             (is_last_obj)  ? "last obj"  : "" );
    } else {
        // above DEBUG: log all.
        p_db("save snapshot (idx %" PRIu64 ", term %" PRIu64 ") offset 0x%" PRIx64
             ", %s %s",
             req.get_snapshot().get_last_log_idx(),
             req.get_snapshot().get_last_log_term(),
             req.get_offset(),
             (is_first_obj) ? "first obj" : "",
             (is_last_obj)  ? "last obj"  : "" );
    }

    cb_func::Param param(id_, leader_);
    param.ctx = &req;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::SaveSnapshot, &param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, return false");
        return false;
    }

    // Set flag to avoid initiating election by this node.
    receiving_snapshot_ = true;
    et_cnt_receiving_snapshot_ = 0;

    // Set initialized flag
    if (!initialized_) initialized_ = true;

    if (req.get_snapshot().get_type() == snapshot::raw_binary) {
        // LCOV_EXCL_START
        // Raw binary type (original).
        state_machine_->save_snapshot_data(req.get_snapshot(),
                                           req.get_offset(),
                                           req.get_data());
        // LCOV_EXCL_STOP

    } else {
        // Logical object type.
        ulong obj_id = req.get_offset();
        buffer& buf = req.get_data();
        buf.pos(0);
        state_machine_->save_logical_snp_obj(req.get_snapshot(),
                                             obj_id,
                                             buf,
                                             is_first_obj,
                                             is_last_obj);
        req.set_offset(obj_id);
    }

    if (is_last_obj) {
        // let's pause committing in backgroud so it doesn't access logs
        // while they are being compacted
        pause_state_machine_exeuction();
        size_t wait_count = 0;
        while (!wait_for_state_machine_pause(500)) {
            p_in("waiting for state machine pause before applying snapshot: count %zu",
                 ++wait_count);
        }
        while (sm_commit_exec_in_progress_)
            std::this_thread::sleep_for(std::chrono::milliseconds(500));

        struct ExecAutoResume {
            explicit ExecAutoResume(std::function<void()> func) : clean_func_(func) {}
            ~ExecAutoResume() { clean_func_(); }
            std::function<void()> clean_func_;
        } exec_auto_resume([this](){ resume_state_machine_execution(); });


        receiving_snapshot_ = false;

        // Only follower will run this piece of code, but let's check it again
        if (role_ != srv_role::follower) {
            // LCOV_EXCL_START
            p_er("bad server role for applying a snapshot, exit for debugging");
            ctx_->state_mgr_->system_exit(raft_err::N11_not_follower_for_snapshot);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        p_in( "successfully receive a snapshot (idx %" PRIu64 " term %" PRIu64
              ") from leader",
              req.get_snapshot().get_last_log_idx(),
              req.get_snapshot().get_last_log_term() );
        if (log_store_->compact(req.get_snapshot().get_last_log_idx())) {
            // The state machine will not be able to commit anything before the
            // snapshot is applied, so make this synchronously with election
            // timer stopped as usually applying a snapshot may take a very
            // long time
            stop_election_timer();
            p_in("successfully compact the log store, will now ask the "
                 "statemachine to apply the snapshot");
            if (!state_machine_->apply_snapshot(req.get_snapshot())) {
                // LCOV_EXCL_START
                p_er("failed to apply the snapshot after log compacted, "
                     "to ensure the safety, will shutdown the system");
                ctx_->state_mgr_->system_exit(raft_err::N12_apply_snapshot_failed);
                ::exit(-1);
                return false;
                // LCOV_EXCL_STOP
            }

            reconfigure(req.get_snapshot().get_last_config());

            ptr<cluster_config> c_conf = get_config();
            ctx_->state_mgr_->save_config(*c_conf);

            precommit_index_ = req.get_snapshot().get_last_log_idx();
            sm_commit_index_ = req.get_snapshot().get_last_log_idx();
            quick_commit_index_ = req.get_snapshot().get_last_log_idx();
            lagging_sm_target_index_ = req.get_snapshot().get_last_log_idx();

            ctx_->state_mgr_->save_state(*state_);

            ptr<snapshot> new_snp = cs_new<snapshot>
                                    ( req.get_snapshot().get_last_log_idx(),
                                      req.get_snapshot().get_last_log_term(),
                                      c_conf,
                                      req.get_snapshot().size(),
                                      req.get_snapshot().get_type() );
            set_last_snapshot(new_snp);

            restart_election_timer();
            p_in("snapshot idx %" PRIu64 " term %" PRIu64 " is successfully applied, "
                 "log start %" PRIu64 " last idx %" PRIu64,
                 new_snp->get_last_log_idx(),
                 new_snp->get_last_log_term(),
                 log_store_->start_index(),
                 log_store_->next_slot() - 1);

        } else {
            p_er("failed to compact the log store after a snapshot is received, "
                 "will ask the leader to retry");
            return false;
        }
    }

 } catch (...) {
    // LCOV_EXCL_START
    p_er("failed to handle snapshot installation due to system errors");
    ctx_->state_mgr_->system_exit(raft_err::N13_snapshot_install_failed);
    ::exit(-1);
    return false;
    // LCOV_EXCL_STOP
 }

    return true;
}